

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  uchar *puVar4;
  long lVar5;
  ImFont *pIVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uchar *puVar12;
  ulong uVar13;
  uchar *__dest;
  uchar *puVar14;
  byte *pbVar15;
  byte *pbVar16;
  uchar *puVar17;
  uint uVar18;
  ImFontConfig font_cfg;
  ImFontConfig local_140;
  ImFontConfig local_b8;
  
  uVar9 = *(uint *)((long)compressed_ttf_data + 8);
  uVar18 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  puVar4 = (uchar *)ImGui::MemAlloc((ulong)uVar18);
  uVar9 = *compressed_ttf_data;
  if (((uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18) ==
       0x57bc0000) &&
     (uVar9 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar9 >> 0x18 == 0 && (uVar9 & 0xff0000) == 0) && (uVar9 & 0xff00) == 0) &&
     (uVar9 & 0xff) == 0)) {
    uVar9 = *(uint *)((long)compressed_ttf_data + 8);
    uVar13 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18
                    );
    puVar1 = puVar4 + uVar13;
    puVar14 = puVar4 + uVar13 + 1;
    __dest = puVar4;
    pbVar15 = (byte *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e = puVar1;
    stb__barrier_out_b = puVar4;
    stb__dout = puVar4;
    do {
      bVar3 = *pbVar15;
      uVar9 = (uint)bVar3;
      if (bVar3 < 0x20) {
        if (bVar3 < 0x18) {
          if (bVar3 < 0x10) {
            if (bVar3 < 8) {
              if (bVar3 == 4) {
                uVar8 = *(ushort *)(pbVar15 + 4) << 8 | *(ushort *)(pbVar15 + 4) >> 8;
                puVar12 = __dest + (ulong)uVar8 + 1;
                if (__dest + (ulong)uVar8 + 1 <= puVar1) {
                  bVar3 = pbVar15[1];
                  bVar7 = pbVar15[2];
                  bVar2 = pbVar15[3];
                  puVar12 = puVar14;
                  if (puVar4 <= __dest + ~((ulong)bVar3 * 0x10000 + (ulong)bVar2 |
                                          (ulong)bVar7 * 0x100)) {
                    iVar10 = uVar8 + 1;
                    do {
                      puVar12 = __dest + 1;
                      *__dest = __dest[~((ulong)bVar2 + (ulong)bVar7 * 0x100) +
                                       (ulong)bVar3 * -0x10000];
                      iVar10 = iVar10 + -1;
                      __dest = puVar12;
                    } while (iVar10 != 0);
                  }
                }
                pbVar16 = pbVar15 + 6;
                stb__dout = puVar12;
              }
              else {
                if (uVar9 != 6) {
                  if (uVar9 == 7) {
                    uVar13 = (ulong)(ushort)(*(ushort *)(pbVar15 + 1) << 8 |
                                            *(ushort *)(pbVar15 + 1) >> 8);
                    puVar17 = __dest + uVar13 + 1;
                    puVar12 = puVar17;
                    if ((puVar17 <= puVar1) &&
                       (puVar12 = puVar14, compressed_ttf_data <= pbVar15 + 3)) {
                      memcpy(__dest,pbVar15 + 3,uVar13 + 1);
                      uVar13 = (ulong)(ushort)(*(ushort *)(pbVar15 + 1) << 8 |
                                              *(ushort *)(pbVar15 + 1) >> 8);
                      puVar12 = puVar17;
                    }
                    lVar5 = 4;
                    stb__dout = puVar12;
                    goto LAB_0013366a;
                  }
                  break;
                }
                puVar12 = __dest + (ulong)pbVar15[4] + 1;
                if (__dest + (ulong)pbVar15[4] + 1 <= puVar1) {
                  bVar3 = pbVar15[1];
                  bVar7 = pbVar15[2];
                  bVar2 = pbVar15[3];
                  puVar12 = puVar14;
                  if (puVar4 <= __dest + ~((ulong)bVar3 * 0x10000 + (ulong)bVar2 |
                                          (ulong)bVar7 * 0x100)) {
                    uVar13 = (ulong)pbVar15[4] + 1;
                    do {
                      puVar12 = __dest + 1;
                      *__dest = __dest[~((ulong)bVar2 + (ulong)bVar7 * 0x100) +
                                       (ulong)bVar3 * -0x10000];
                      uVar9 = (int)uVar13 - 1;
                      uVar13 = (ulong)uVar9;
                      __dest = puVar12;
                    } while (uVar9 != 0);
                  }
                }
                pbVar16 = pbVar15 + 5;
                stb__dout = puVar12;
              }
            }
            else {
              bVar7 = pbVar15[1];
              uVar13 = (ulong)((uVar9 * 0x100 + (uint)bVar7) - 0x7ff);
              puVar12 = __dest + uVar13;
              puVar17 = puVar12;
              if ((puVar12 <= puVar1) && (puVar17 = puVar14, compressed_ttf_data <= pbVar15 + 2)) {
                memcpy(__dest,pbVar15 + 2,uVar13);
                bVar3 = *pbVar15;
                bVar7 = pbVar15[1];
                puVar17 = puVar12;
              }
              uVar13 = (ulong)CONCAT11(bVar3,bVar7);
              lVar5 = -0x7fd;
              stb__dout = puVar17;
LAB_0013366a:
              pbVar16 = pbVar15 + uVar13 + lVar5;
              puVar12 = stb__dout;
              if (pbVar16 == pbVar15) break;
            }
          }
          else {
            uVar8 = *(ushort *)(pbVar15 + 3) << 8 | *(ushort *)(pbVar15 + 3) >> 8;
            puVar12 = __dest + (ulong)uVar8 + 1;
            if ((__dest + (ulong)uVar8 + 1 <= puVar1) &&
               (uVar13 = (ulong)(((uint)pbVar15[1] * 0x100 +
                                 ((uint)pbVar15[2] | (uint)bVar3 << 0x10)) - 0xfffff),
               puVar12 = puVar14, puVar4 <= __dest + -uVar13)) {
              iVar10 = uVar8 + 1;
              do {
                puVar12 = __dest + 1;
                *__dest = __dest[-uVar13];
                iVar10 = iVar10 + -1;
                __dest = puVar12;
              } while (iVar10 != 0);
            }
            pbVar16 = pbVar15 + 5;
            stb__dout = puVar12;
          }
        }
        else {
          puVar12 = __dest + (ulong)pbVar15[3] + 1;
          if ((__dest + (ulong)pbVar15[3] + 1 <= puVar1) &&
             (uVar13 = (ulong)(((uint)pbVar15[1] * 0x100 + ((uint)pbVar15[2] | (uint)bVar3 << 0x10))
                              - 0x17ffff), puVar12 = puVar14, puVar4 <= __dest + -uVar13)) {
            uVar11 = (ulong)pbVar15[3] + 1;
            do {
              puVar12 = __dest + 1;
              *__dest = __dest[-uVar13];
              uVar9 = (int)uVar11 - 1;
              uVar11 = (ulong)uVar9;
              __dest = puVar12;
            } while (uVar9 != 0);
          }
          pbVar16 = pbVar15 + 4;
          stb__dout = puVar12;
        }
      }
      else if ((char)bVar3 < '\0') {
        uVar9 = uVar9 - 0x7f;
        uVar13 = (ulong)uVar9;
        puVar12 = __dest + uVar13;
        puVar17 = puVar12;
        if ((puVar12 <= puVar1) &&
           (bVar3 = pbVar15[1], puVar12 = puVar14, puVar17 = puVar14,
           puVar4 <= __dest + ~(ulong)bVar3)) {
          while (puVar12 = __dest, puVar17 = stb__dout, uVar9 != 0) {
            stb__dout = __dest + 1;
            *__dest = __dest[~(ulong)bVar3];
            uVar9 = (int)uVar13 - 1;
            uVar13 = (ulong)uVar9;
            __dest = stb__dout;
          }
        }
        stb__dout = puVar17;
        pbVar16 = pbVar15 + 2;
      }
      else {
        if (bVar3 < 0x40) {
          puVar12 = __dest + (uVar9 - 0x1f);
          puVar17 = puVar12;
          if ((puVar12 <= puVar1) && (puVar17 = puVar14, compressed_ttf_data <= pbVar15 + 1)) {
            memcpy(__dest,pbVar15 + 1,(ulong)(uVar9 - 0x1f));
            bVar3 = *pbVar15;
            puVar17 = puVar12;
          }
          uVar13 = (ulong)bVar3;
          lVar5 = -0x1e;
          stb__dout = puVar17;
          goto LAB_0013366a;
        }
        puVar12 = __dest + (ulong)pbVar15[2] + 1;
        if ((__dest + (ulong)pbVar15[2] + 1 <= puVar1) &&
           (uVar13 = (ulong)(((uint)bVar3 * 0x100 + (uint)pbVar15[1]) - 0x3fff), puVar12 = puVar14,
           puVar4 <= __dest + -uVar13)) {
          uVar11 = (ulong)pbVar15[2] + 1;
          do {
            puVar12 = __dest + 1;
            *__dest = __dest[-uVar13];
            uVar9 = (int)uVar11 - 1;
            uVar11 = (ulong)uVar9;
            __dest = puVar12;
          } while (uVar9 != 0);
        }
        pbVar16 = pbVar15 + 3;
        stb__dout = puVar12;
      }
      __dest = puVar12;
      pbVar15 = pbVar16;
    } while (puVar12 <= puVar1);
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    ImFontConfig::ImFontConfig(&local_140);
  }
  else {
    memcpy(&local_140,font_cfg_template,0x88);
  }
  local_140.FontDataOwnedByAtlas = true;
  memcpy(&local_b8,&local_140,0x88);
  if (glyph_ranges != (ImWchar *)0x0) {
    local_b8.GlyphRanges = glyph_ranges;
  }
  local_b8.FontData = puVar4;
  local_b8.FontDataSize = uVar18;
  local_b8.SizePixels = size_pixels;
  pIVar6 = AddFont(this,&local_b8);
  return pIVar6;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}